

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall MPLSParser::parsePlayList(MPLSParser *this,uint8_t *buffer,int len)

{
  uint uVar1;
  uint uVar2;
  BitStreamReader reader;
  
  reader.super_BitStream.m_totalBits = 0;
  reader.m_curVal = 0;
  reader.m_bitLeft = 0;
  reader.super_BitStream.m_buffer = (uint *)0x0;
  reader.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamReader::setBuffer(&reader,buffer,buffer + len);
  BitStreamReader::skipBits(&reader,0x20);
  BitStreamReader::skipBits(&reader,0x10);
  uVar1 = BitStreamReader::getBits(&reader,0x10);
  uVar2 = BitStreamReader::getBits(&reader,0x10);
  this->number_of_SubPaths = uVar2;
  uVar2 = 0;
  if ((int)uVar1 < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    parsePlayItem(this,&reader,uVar2);
  }
  return;
}

Assistant:

void MPLSParser::parsePlayList(uint8_t* buffer, const int len)
{
    BitStreamReader reader{};
    reader.setBuffer(buffer, buffer + len);
    reader.skipBits(32);  // length
    reader.skipBits(16);  // reserved_for_future_use
    const int number_of_PlayItems = reader.getBits<int>(16);
    number_of_SubPaths = reader.getBits<int>(16);
    for (int PlayItem_id = 0; PlayItem_id < number_of_PlayItems; PlayItem_id++)
    {
        parsePlayItem(reader, PlayItem_id);
    }
    for (int SubPath_id = 0; SubPath_id < number_of_SubPaths; SubPath_id++)
    {
        // SubPath(); // not implemented now
    }
}